

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeInsertCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell,int iHeight)

{
  int iVar1;
  RtreeNode *pRVar2;
  RtreeNode *pChild;
  int rc;
  int iHeight_local;
  RtreeCell *pCell_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  if ((0 < iHeight) && (pRVar2 = nodeHashLookup(pRtree,pCell->iRowid), pRVar2 != (RtreeNode *)0x0))
  {
    nodeRelease(pRtree,pRVar2->pParent);
    nodeReference(pNode);
    pRVar2->pParent = pNode;
  }
  iVar1 = nodeInsertCell(pRtree,pNode,pCell);
  if (iVar1 == 0) {
    pChild._0_4_ = AdjustTree(pRtree,pNode,pCell);
    if ((int)pChild == 0) {
      if (iHeight == 0) {
        pChild._0_4_ = rowidWrite(pRtree,pCell->iRowid,pNode->iNode);
      }
      else {
        pChild._0_4_ = parentWrite(pRtree,pCell->iRowid,pNode->iNode);
      }
    }
  }
  else if ((pRtree->iReinsertHeight < iHeight) && (pNode->iNode != 1)) {
    pRtree->iReinsertHeight = iHeight;
    pChild._0_4_ = Reinsert(pRtree,pNode,pCell,iHeight);
  }
  else {
    pChild._0_4_ = SplitNode(pRtree,pNode,pCell,iHeight);
  }
  return (int)pChild;
}

Assistant:

static int rtreeInsertCell(
  Rtree *pRtree,
  RtreeNode *pNode,
  RtreeCell *pCell,
  int iHeight
){
  int rc = SQLITE_OK;
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, pCell->iRowid);
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  if( nodeInsertCell(pRtree, pNode, pCell) ){
    if( iHeight<=pRtree->iReinsertHeight || pNode->iNode==1){
      rc = SplitNode(pRtree, pNode, pCell, iHeight);
    }else{
      pRtree->iReinsertHeight = iHeight;
      rc = Reinsert(pRtree, pNode, pCell, iHeight);
    }
  }else{
    rc = AdjustTree(pRtree, pNode, pCell);
    if( rc==SQLITE_OK ){
      if( iHeight==0 ){
        rc = rowidWrite(pRtree, pCell->iRowid, pNode->iNode);
      }else{
        rc = parentWrite(pRtree, pCell->iRowid, pNode->iNode);
      }
    }
  }
  return rc;
}